

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O1

void SstStreamDestroy(SstStream Stream)

{
  pthread_mutex_t *__mutex;
  StepRequest __ptr;
  CP_PeerConnection *pCVar1;
  int *__ptr_00;
  FFSFormatList __ptr_01;
  FFSFormatBlock *pFVar2;
  char *pcVar3;
  CP_GlobalCMInfo __ptr_02;
  WS_ReaderInfo p_Var4;
  CMConnection *pp_Var5;
  long lVar6;
  _TimestepMetadataList *p_Var7;
  long lVar8;
  _SstStream StackStream;
  _SstStream _Stack_338;
  
  CP_verbose(Stream,PerStepVerbose,"Destroying stream %p, name %s\n",Stream,Stream->Filename);
  __mutex = &Stream->DataLock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  memcpy(&_Stack_338,Stream,0x310);
  Stream->Status = Destroyed;
  p_Var7 = Stream->Timesteps;
  while (p_Var7 != (_TimestepMetadataList *)0x0) {
    p_Var7 = p_Var7->Next;
    free(Stream->Timesteps);
    Stream->Timesteps = p_Var7;
  }
  while (__ptr = Stream->StepRequestQueue, __ptr != (StepRequest)0x0) {
    Stream->StepRequestQueue = __ptr->Next;
    free(__ptr);
  }
  if (Stream->DP_Stream != (void *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    (*(&Stream->DP_Interface->destroyReader)[Stream->Role != ReaderRole])(&Svcs,Stream->DP_Stream);
    Stream->DP_Stream = (void *)0x0;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
  }
  if (Stream->Readers != (WS_ReaderInfo *)0x0) {
    if (0 < Stream->ReaderCount) {
      lVar8 = 0;
      do {
        pCVar1 = Stream->Readers[lVar8]->Connections;
        if (pCVar1 != (CP_PeerConnection *)0x0) {
          p_Var4 = Stream->Readers[lVar8];
          if (0 < p_Var4->ReaderCohortSize) {
            pp_Var5 = &pCVar1->CMconn;
            lVar6 = 0;
            do {
              if (*pp_Var5 != (CMConnection)0x0) {
                CMConnection_dereference();
                *pp_Var5 = (CMConnection)0x0;
              }
              free_attr_list(((CP_PeerConnection *)(pp_Var5 + -2))->ContactList);
              lVar6 = lVar6 + 1;
              p_Var4 = Stream->Readers[lVar8];
              pp_Var5 = pp_Var5 + 3;
            } while (lVar6 < p_Var4->ReaderCohortSize);
          }
          free(p_Var4->Connections);
          Stream->Readers[lVar8]->Connections = (CP_PeerConnection *)0x0;
        }
        __ptr_00 = Stream->Readers[lVar8]->Peers;
        if (__ptr_00 != (int *)0x0) {
          free(__ptr_00);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < Stream->ReaderCount);
    }
    Stream->ReaderCount = 0;
    free(Stream->Readers);
    Stream->Readers = (WS_ReaderInfo *)0x0;
  }
  __ptr_01 = Stream->PreviousFormats;
  Stream->PreviousFormats = (FFSFormatList)0x0;
  free(Stream->ReleaseList);
  free(Stream->LockDefnsList);
  while (__ptr_01 != (FFSFormatList)0x0) {
    pFVar2 = __ptr_01->Next;
    free(__ptr_01->FormatServerRep);
    free(__ptr_01->FormatIDRep);
    free(__ptr_01);
    __ptr_01 = pFVar2;
  }
  if ((Stream->WriterConfigParams != (_SstParams *)0x0) &&
     (Stream->WriterConfigParams->MarshalMethod == 0)) {
    FFSFreeMarshalData(Stream);
    if (Stream->M != (void *)0x0) {
      free(Stream->M);
    }
    if (Stream->D != (void *)0x0) {
      free(Stream->D);
    }
  }
  if (Stream->Role == ReaderRole) {
    if (Stream->ReaderFFSContext != (FFSContext)0x0) {
      free_FFSContext();
      Stream->ReaderFFSContext = (FFSContext)0x0;
    }
    if (0 < Stream->WriterCohortSize) {
      lVar6 = 0;
      lVar8 = 0;
      do {
        free_attr_list(*(undefined8 *)((long)&Stream->ConnectionsToWriter->ContactList + lVar6));
        if (*(long *)((long)&Stream->ConnectionsToWriter->CMconn + lVar6) != 0) {
          CMConnection_dereference();
          *(undefined8 *)((long)&Stream->ConnectionsToWriter->CMconn + lVar6) = 0;
        }
        lVar8 = lVar8 + 1;
        lVar6 = lVar6 + 0x18;
      } while (lVar8 < Stream->WriterCohortSize);
    }
    if (Stream->ConnectionsToWriter != (CP_PeerConnection *)0x0) {
      free(Stream->ConnectionsToWriter);
      Stream->ConnectionsToWriter = (CP_PeerConnection *)0x0;
    }
    free(Stream->Peers);
    if (Stream->RanksRead != (char *)0x0) {
      free(Stream->RanksRead);
    }
  }
  else if (Stream->ConfigParams->MarshalMethod == 0) {
    FFSFreeMarshalData(Stream);
  }
  pcVar3 = Stream->ConfigParams->DataTransport;
  if (pcVar3 != (char *)0x0) {
    free(pcVar3);
  }
  pcVar3 = Stream->ConfigParams->WANDataTransport;
  if (pcVar3 != (char *)0x0) {
    free(pcVar3);
  }
  pcVar3 = Stream->ConfigParams->ControlTransport;
  if (pcVar3 != (char *)0x0) {
    free(pcVar3);
  }
  pcVar3 = Stream->ConfigParams->NetworkInterface;
  if (pcVar3 != (char *)0x0) {
    free(pcVar3);
  }
  pcVar3 = Stream->ConfigParams->ControlInterface;
  if (pcVar3 != (char *)0x0) {
    free(pcVar3);
  }
  pcVar3 = Stream->ConfigParams->DataInterface;
  if (pcVar3 != (char *)0x0) {
    free(pcVar3);
  }
  pcVar3 = Stream->ConfigParams->ControlModule;
  if (pcVar3 != (char *)0x0) {
    free(pcVar3);
  }
  if (Stream->Filename != (char *)0x0) {
    free(Stream->Filename);
    Stream->Filename = (char *)0x0;
  }
  if (Stream->AbsoluteFilename != (char *)0x0) {
    free(Stream->AbsoluteFilename);
    Stream->AbsoluteFilename = (char *)0x0;
  }
  if (Stream->ParamsBlock != (void *)0x0) {
    free(Stream->ParamsBlock);
    Stream->ParamsBlock = (void *)0x0;
  }
  if (Stream->CPInfo->ffs_c != (FFSContext)0x0) {
    free_FFSContext();
  }
  if (Stream->CPInfo->fm_c != (FMContext)0x0) {
    free_FMcontext();
  }
  FreeCustomStructs(&Stream->CPInfo->CustomStructs);
  free(Stream->CPInfo);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  pthread_mutex_lock((pthread_mutex_t *)&StateMutex);
  SharedCMInfoRefCount = SharedCMInfoRefCount + -1;
  if (SharedCMInfoRefCount == 0) {
    CP_verbose(Stream,PerStepVerbose,"Reference count now zero, Destroying process SST info cache\n"
              );
    CManager_close(SharedCMInfo->cm);
    FreeCustomStructs(&SharedCMInfo->CustomStructs);
    CP_verbose(Stream,PerStepVerbose,"Freeing LastCallList\n");
    __ptr_02 = SharedCMInfo;
    if (0 < SharedCMInfo->LastCallFreeCount) {
      lVar8 = 0;
      do {
        free(__ptr_02->LastCallFreeList[lVar8]);
        lVar8 = lVar8 + 1;
      } while (lVar8 < __ptr_02->LastCallFreeCount);
    }
    free(__ptr_02->LastCallFreeList);
    free(__ptr_02);
    SharedCMInfo = (CP_GlobalCMInfo)0x0;
    if (CP_SstParamsList != (FMField *)0x0) {
      free_FMfield_list();
    }
    CP_SstParamsList = (FMField *)0x0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&StateMutex);
  CP_verbose(&_Stack_338,PerStepVerbose,"SstStreamDestroy successful, returning\n");
  return;
}

Assistant:

extern void SstStreamDestroy(SstStream Stream)
{
    /*
     * StackStream is only used to access verbosity info
     * in a safe way after all streams have been destroyed
     */
    struct _SstStream StackStream;
    CP_verbose(Stream, PerStepVerbose, "Destroying stream %p, name %s\n", Stream, Stream->Filename);
    STREAM_MUTEX_LOCK(Stream);
    StackStream = *Stream;
    Stream->Status = Destroyed;
    struct _TimestepMetadataList *Next = Stream->Timesteps;
    while (Next)
    {
        Next = Next->Next;
        free(Stream->Timesteps);
        Stream->Timesteps = Next;
    }

    while (Stream->StepRequestQueue)
    {
        StepRequest Request = Stream->StepRequestQueue;
        Stream->StepRequestQueue = Request->Next;
        free(Request);
    }
    if (Stream->DP_Stream)
    {
        STREAM_MUTEX_UNLOCK(Stream);
        if (Stream->Role == ReaderRole)
        {
            Stream->DP_Interface->destroyReader(&Svcs, Stream->DP_Stream);
        }
        else
        {
            Stream->DP_Interface->destroyWriter(&Svcs, Stream->DP_Stream);
        }
        Stream->DP_Stream = NULL;
        STREAM_MUTEX_LOCK(Stream);
    }

    if (Stream->Readers)
    {
        for (int i = 0; i < Stream->ReaderCount; i++)
        {
            CP_PeerConnection *connections_to_reader = Stream->Readers[i]->Connections;

            if (connections_to_reader)
            {
                for (int j = 0; j < Stream->Readers[i]->ReaderCohortSize; j++)
                {
                    if (connections_to_reader[j].CMconn)
                    {
                        CMConnection_dereference(connections_to_reader[j].CMconn);
                        connections_to_reader[j].CMconn = NULL;
                    }
                    free_attr_list(connections_to_reader[j].ContactList);
                }
                free(Stream->Readers[i]->Connections);
                Stream->Readers[i]->Connections = NULL;
            }
            if (Stream->Readers[i]->Peers)
            {
                free(Stream->Readers[i]->Peers);
            }
            // Stream->Readers[i] is free'd in LastCall
        }
        Stream->ReaderCount = 0;
        free(Stream->Readers);
        Stream->Readers = NULL;
    }

    FFSFormatList FFSList = Stream->PreviousFormats;
    Stream->PreviousFormats = NULL;
    free(Stream->ReleaseList);
    free(Stream->LockDefnsList);
    while (FFSList)
    {
        FFSFormatList Tmp = FFSList->Next;
        /* Server rep and ID here are copied */
        free(FFSList->FormatServerRep);
        free(FFSList->FormatIDRep);
        free(FFSList);
        FFSList = Tmp;
    }
    if (Stream->WriterConfigParams && (Stream->WriterConfigParams->MarshalMethod == SstMarshalFFS))
    {
        FFSFreeMarshalData(Stream);
        if (Stream->M)
            free(Stream->M);
        if (Stream->D)
            free(Stream->D);
    }

    if (Stream->Role == ReaderRole)
    {
        /* reader side */
        if (Stream->ReaderFFSContext)
        {
            free_FFSContext(Stream->ReaderFFSContext);
            Stream->ReaderFFSContext = NULL;
        }
        for (int i = 0; i < Stream->WriterCohortSize; i++)
        {
            free_attr_list(Stream->ConnectionsToWriter[i].ContactList);
            if (Stream->ConnectionsToWriter[i].CMconn)
            {
                CMConnection_dereference(Stream->ConnectionsToWriter[i].CMconn);
                Stream->ConnectionsToWriter[i].CMconn = NULL;
            }
        }
        if (Stream->ConnectionsToWriter)
        {
            free(Stream->ConnectionsToWriter);
            Stream->ConnectionsToWriter = NULL;
        }
        free(Stream->Peers);
        if (Stream->RanksRead)
            free(Stream->RanksRead);
    }
    else if (Stream->ConfigParams->MarshalMethod == SstMarshalFFS)
    {
        FFSFreeMarshalData(Stream);
    }
    if (Stream->ConfigParams->DataTransport)
        free(Stream->ConfigParams->DataTransport);
    if (Stream->ConfigParams->WANDataTransport)
        free(Stream->ConfigParams->WANDataTransport);
    if (Stream->ConfigParams->ControlTransport)
        free(Stream->ConfigParams->ControlTransport);
    if (Stream->ConfigParams->NetworkInterface)
        free(Stream->ConfigParams->NetworkInterface);
    if (Stream->ConfigParams->ControlInterface)
        free(Stream->ConfigParams->ControlInterface);
    if (Stream->ConfigParams->DataInterface)
        free(Stream->ConfigParams->DataInterface);
    if (Stream->ConfigParams->ControlModule)
        free(Stream->ConfigParams->ControlModule);

    if (Stream->Filename)
    {
        free(Stream->Filename);
        Stream->Filename = NULL;
    }
    if (Stream->AbsoluteFilename)
    {
        free(Stream->AbsoluteFilename);
        Stream->AbsoluteFilename = NULL;
    }

    if (Stream->ParamsBlock)
    {
        free(Stream->ParamsBlock);
        Stream->ParamsBlock = NULL;
    }
    if (Stream->CPInfo->ffs_c)
        free_FFSContext(Stream->CPInfo->ffs_c);
    if (Stream->CPInfo->fm_c)
        free_FMcontext(Stream->CPInfo->fm_c);
    FreeCustomStructs(&Stream->CPInfo->CustomStructs);
    free(Stream->CPInfo);

    STREAM_MUTEX_UNLOCK(Stream);
    //   Stream is free'd in LastCall

    pthread_mutex_lock(&StateMutex);
    SharedCMInfoRefCount--;
    if (SharedCMInfoRefCount == 0)
    {
        CP_verbose(Stream, PerStepVerbose,
                   "Reference count now zero, Destroying process SST info cache\n");
        CManager_close(SharedCMInfo->cm);
        FreeCustomStructs(&SharedCMInfo->CustomStructs);
        CP_verbose(Stream, PerStepVerbose, "Freeing LastCallList\n");
        for (int i = 0; i < SharedCMInfo->LastCallFreeCount; i++)
        {
            free(SharedCMInfo->LastCallFreeList[i]);
        }
        free(SharedCMInfo->LastCallFreeList);
        free(SharedCMInfo);
        SharedCMInfo = NULL;
        if (CP_SstParamsList)
            free_FMfield_list(CP_SstParamsList);
        CP_SstParamsList = NULL;
    }
    pthread_mutex_unlock(&StateMutex);
    CP_verbose(&StackStream, PerStepVerbose, "SstStreamDestroy successful, returning\n");
}